

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EratBig.cpp
# Opt level: O0

void __thiscall
primesieve::EratBig::crossOff(EratBig *this,uint8_t *sieve,SievingPrime *prime,SievingPrime *end)

{
  ulong uVar1;
  undefined8 uVar2;
  SievingPrime *this_00;
  bool bVar3;
  SievingPrime **ppSVar4;
  size_t sVar5;
  size_t pos;
  SievingPrime **sievingPrime_00;
  WheelElement *pWVar6;
  long lVar7;
  ulong uVar8;
  MemoryPool *this_01;
  ulong uVar9;
  SievingPrime *in_RCX;
  SievingPrime *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t segment;
  size_t sievingPrime;
  size_t wheelIndex;
  size_t multipleIndex;
  size_t log2SieveSize;
  size_t moduloSieveSize;
  MemoryPool *memoryPool;
  SievingPrime **buckets;
  SievingPrime *local_18;
  
  ppSVar4 = Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::data
                      ((Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>
                        *)(in_RDI + 0x30));
  uVar1 = *(ulong *)(in_RDI + 0x20);
  uVar2 = *(undefined8 *)(in_RDI + 0x18);
  for (local_18 = in_RDX; local_18 != in_RCX; local_18 = local_18 + 1) {
    sVar5 = SievingPrime::getMultipleIndex(local_18);
    pos = SievingPrime::getWheelIndex(local_18);
    sievingPrime_00 = (SievingPrime **)SievingPrime::getSievingPrime(local_18);
    pWVar6 = Array<(anonymous_namespace)::WheelElement,_384UL>::operator[]
                       ((Array<(anonymous_namespace)::WheelElement,_384UL> *)
                        (anonymous_namespace)::wheel210,pos);
    *(byte *)(in_RSI + sVar5) = *(byte *)(in_RSI + sVar5) & pWVar6->unsetBit;
    pWVar6 = Array<(anonymous_namespace)::WheelElement,_384UL>::operator[]
                       ((Array<(anonymous_namespace)::WheelElement,_384UL> *)
                        (anonymous_namespace)::wheel210,pos);
    lVar7 = (ulong)pWVar6->nextMultipleFactor * (long)sievingPrime_00;
    pWVar6 = Array<(anonymous_namespace)::WheelElement,_384UL>::operator[]
                       ((Array<(anonymous_namespace)::WheelElement,_384UL> *)
                        (anonymous_namespace)::wheel210,pos);
    uVar8 = (ulong)pWVar6->correct + lVar7 + sVar5;
    pWVar6 = Array<(anonymous_namespace)::WheelElement,_384UL>::operator[]
                       ((Array<(anonymous_namespace)::WheelElement,_384UL> *)
                        (anonymous_namespace)::wheel210,pos);
    this_01 = (MemoryPool *)(ulong)pWVar6->next;
    uVar9 = uVar8 >> ((byte)uVar2 & 0x3f);
    bVar3 = Bucket::isFull(ppSVar4[uVar9]);
    if (bVar3) {
      MemoryPool::addBucket(this_01,sievingPrime_00);
    }
    this_00 = ppSVar4[uVar9];
    ppSVar4[uVar9] = this_00 + 1;
    SievingPrime::set(this_00,(size_t)sievingPrime_00,uVar1 & uVar8,(size_t)this_01);
  }
  return;
}

Assistant:

void EratBig::crossOff(uint8_t* sieve,
                       SievingPrime* prime,
                       SievingPrime* end)
{
  auto buckets = buckets_.data();
  MemoryPool& memoryPool = *memoryPool_;
  std::size_t moduloSieveSize = moduloSieveSize_;
  std::size_t log2SieveSize = log2SieveSize_;

  for (; prime != end; prime++)
  {
    std::size_t multipleIndex = prime->getMultipleIndex();
    std::size_t wheelIndex    = prime->getWheelIndex();
    std::size_t sievingPrime  = prime->getSievingPrime();

    // Cross-off the current multiple (unset bit)
    // and calculate the next multiple.
    sieve[multipleIndex] &= wheel210[wheelIndex].unsetBit;
    multipleIndex += wheel210[wheelIndex].nextMultipleFactor * sievingPrime;
    multipleIndex += wheel210[wheelIndex].correct;
    wheelIndex = wheel210[wheelIndex].next;
    std::size_t segment = multipleIndex >> log2SieveSize;
    multipleIndex &= moduloSieveSize;

    if (Bucket::isFull(buckets[segment]))
      memoryPool.addBucket(buckets[segment]);

    buckets[segment]++->set(sievingPrime, multipleIndex, wheelIndex);
  }
}